

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dymon_pbm.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *string;
  int iVar1;
  arg_lit *paVar2;
  arg_lit *paVar3;
  arg_str *paVar4;
  arg_str *paVar5;
  arg_int *paVar6;
  arg_int *paVar7;
  arg_lit *paVar8;
  arg_file *paVar9;
  ostream *poVar10;
  cJSON *object;
  cJSON *item;
  Dymon *this;
  uint uVar11;
  char *pcVar12;
  undefined **ppuVar13;
  uint uVar14;
  bool bVar15;
  void *argtable [9];
  ifstream f;
  arg_lit *local_288;
  arg_lit *local_280;
  arg_str *local_278;
  arg_str *local_270;
  arg_int *local_268;
  arg_int *local_260;
  arg_lit *local_258;
  arg_file *local_250;
  arg_end *local_248;
  long local_238 [4];
  int aiStack_218 [122];
  
  paVar2 = arg_lit0((char *)0x0,"help","Print help and exit");
  local_288 = paVar2;
  paVar3 = arg_lit0((char *)0x0,"version","Print version and exit");
  local_280 = paVar3;
  paVar4 = arg_str0((char *)0x0,"usb","<DEVICE>","Use USB printer device (e.g. \'/dev/usb/lp1\')");
  local_278 = paVar4;
  paVar5 = arg_str0((char *)0x0,"net","<IP>","Use network printer with IP (e.g. \'192.168.178.23\')"
                   );
  local_270 = paVar5;
  paVar6 = arg_int0((char *)0x0,"model","<NUMBER>","Model number of DYMO LabelWriter (e.g. \'450\')"
                   );
  local_268 = paVar6;
  paVar7 = arg_int0((char *)0x0,"copies","<NUMBER>","Number of copies to be printed [default: 1]");
  local_260 = paVar7;
  paVar8 = arg_lit0((char *)0x0,"debug","Enable debug output");
  local_258 = paVar8;
  paVar9 = arg_file1((char *)0x0,(char *)0x0,"<INPUT>","PBM file to be printed");
  local_250 = paVar9;
  local_248 = arg_end(3);
  arg_parse(argc,argv,&local_288);
  if (paVar2->count != 0) {
    puts("Print P4 portable bitmap on DYMO LabelWriter.\n");
    puts("\x1b[1;4mUsage:\x1b[0m \x1b[1mdymon_pbm\x1b[0m");
    arg_print_syntax(_stdout,&local_288,"\n\n");
    puts("\x1b[1;4mOptions:\x1b[0m");
    arg_print_glossary(_stdout,&local_288,"  %-25s %s\n");
    return 0;
  }
  if (paVar3->count != 0) {
    puts("2.0.0");
    return 0;
  }
  if (paVar4->count == 0) {
    if (paVar5->count == 0) {
      pcVar12 = 
      "\x1b[31mError:\x1b[0m Interface specifier required (one of \'--usb\' or \'--net\')\n";
      goto LAB_001116c0;
    }
  }
  else if (paVar5->count != 0) {
    pcVar12 = "\x1b[31mError:\x1b[0m Only one interface allowed (one of \'--usb\' or \'--net\')\n";
LAB_001116c0:
    puts(pcVar12);
    puts("\x1b[1;4mUsage:\x1b[0m \x1b[1mdymon_pbm\x1b[0m");
    arg_print_syntax(_stdout,&local_288,"\n\n");
    return -1;
  }
  if (paVar9->count == 0) {
    puts("\x1b[31mError:\x1b[0m Input file required\n");
    print_usage(&local_288);
    return -1;
  }
  if (paVar8->count == 0) {
    dymonDebug = 1;
  }
  pcVar12 = *paVar9->filename;
  std::ifstream::ifstream(local_238,pcVar12,_S_in);
  iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18));
  std::ifstream::~ifstream(local_238);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[31mError:\x1b[0m File \'",0x16);
    poVar10 = std::operator<<((ostream *)&std::cout,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\' does not exist",0x10);
    std::endl<char,std::char_traits<char>>(poVar10);
    return -4;
  }
  if (paVar5->count == 0) {
    object = (cJSON *)*paVar4->sval;
    ppuVar13 = &PTR_connect_00117d58;
    if (paVar6->count != 0) {
      bVar15 = *paVar6->ival == 0x1c2;
      goto LAB_00111821;
    }
  }
  else {
    string = *paVar5->sval;
    object = cJSON_CreateObject();
    item = cJSON_CreateString(string);
    cJSON_AddItemToObject(object,"ip",item);
    ppuVar13 = &PTR_connect_00117d00;
  }
  bVar15 = false;
LAB_00111821:
  this = (Dymon *)operator_new(0x38);
  this->connected = false;
  this->lw450flavor = bVar15;
  this->session = 1;
  this->index = 0;
  this->_vptr_Dymon = (_func_int **)ppuVar13;
  *(undefined4 *)&this->field_0x34 = 0xffffffff;
  iVar1 = Dymon::start(this,object);
  if (iVar1 == 0) {
    uVar14 = 1;
    uVar11 = 1;
    if ((paVar7->count == 0) || (uVar11 = *paVar7->ival, 0 < (int)uVar11)) {
      do {
        Dymon::print_bitmap(this,pcVar12,(uint)(uVar14 < uVar11));
        bVar15 = uVar14 != uVar11;
        uVar14 = uVar14 + 1;
      } while (bVar15);
    }
    Dymon::end(this);
  }
  operator_delete(this,0x38);
  return iVar1;
}

Assistant:

int main(int argc, char * argv[])
{
   struct arg_lit * argHelp;
   struct arg_lit * argVersion;
   struct arg_str * argUsb;
   struct arg_str * argNet;
   struct arg_int * argModel;
   struct arg_int * argCopies;
   struct arg_file * argInput;
   struct arg_lit * argDebug;
   struct arg_end * argEnd;
   void * argtable[] =
   {
      argHelp = arg_lit0(NULL, "help", "Print help and exit"),
      argVersion = arg_lit0(NULL, "version", "Print version and exit"),
   #ifdef _WIN32
      argUsb = arg_str0(NULL, "usb", "<ID>", "Use USB printer with vid/pid ID (e.g. 'vid_0922')"),
   #else
      argUsb = arg_str0(NULL, "usb", "<DEVICE>", "Use USB printer device (e.g. '/dev/usb/lp1')"),
   #endif
      argNet = arg_str0(NULL, "net", "<IP>", "Use network printer with IP (e.g. '192.168.178.23')"),
      argModel = arg_int0(NULL, "model", "<NUMBER>", "Model number of DYMO LabelWriter (e.g. '450')"),
      argCopies = arg_int0(NULL, "copies", "<NUMBER>", "Number of copies to be printed [default: 1]"),
      argDebug = arg_lit0(NULL, "debug", "Enable debug output"),
      argInput = arg_file1(NULL, NULL, "<INPUT>", "PBM file to be printed"),
      argEnd = arg_end(3),
   };

   // Parse command line arguments.
   arg_parse(argc, argv, argtable);

   // Help
   if (argHelp->count)
   {
      print_help(argtable);
      return 0;
   }

   // Version
   if (argVersion->count)
   {
      puts(APP_VERSION);
      return 0;
   }

   // Check existance of one (and only one) of the supported interfaces
   if (argUsb->count && argNet->count)
   {
      puts(VT100_RED "Error:" VT100_RESET " Only one interface allowed (one of '--usb' or '--net')\n");
      print_usage(argtable);
      return -1;
   }
   if ((argUsb->count ^ argNet->count) == 0)
   {
      puts(VT100_RED "Error:" VT100_RESET " Interface specifier required (one of '--usb' or '--net')\n");
      print_usage(argtable);
      return -1;
   }

   // Check for input file / pbm
   if (!argInput->count)
   {
      puts(VT100_RED "Error:" VT100_RESET " Input file required\n");
      print_usage(argtable);
      return -1;
   }

   // Check for debug switch
   if (!argDebug->count)
   {
      dymonDebug = 1;
   }

   //check if inpuzt file exists
   const char * const bitmapFile = argInput->filename[0];
   if (!file_exist(bitmapFile))
   {
      cout << VT100_RED "Error:" VT100_RESET " File '" << bitmapFile << "' does not exist" << endl;
      return -4;
   }


   enum {
      NET = 0,
      USB
   } interfaze;
   const char * path;
   bool lw450 = false;

   //get interface and path
   if (argNet->count)
   {
      interfaze = NET;
      const char * const ip = argNet->sval[0];
      cJSON * json = cJSON_CreateObject();
      cJSON_AddItemToObject(json, "ip", cJSON_CreateString(ip)); //wrap the ip address into a json object
      path = (char *)json; //pass this to DymonNet::start, which expects a json object
   }
   else //if (argUsb->count)
   {
      interfaze = USB;
      const char * const dev = argUsb->sval[0];
      const int model = (argModel->count ? argModel->ival[0] : 0);
      lw450 = (model == 450);
   #ifdef _WIN32
      //get the device name, to be used on windows
      //
      static char devname[256];
      int err = usbprint_get_devicename(devname, sizeof(devname), dev); //input something like "vid_0922" and get device name like "\\?\usb#vid_0922&pid_0028#04133046018600#{28d78fad-5a12-11d1-ae5b-0000f803a8c2}"
      if (err != 0)
      {
         cout << "Can't find any USB connected DYMO" << endl;
         return -2;
      }
      path = devname;
   #else
      path = dev;
   #endif
   }


   // Create instance
   Dymon * dymon;
   if (interfaze == NET)
   {
      dymon = new DymonNet;
   }
   else //interfaze == USB
   {
      dymon = new DymonUsb(1, lw450);
   }

   // Print label
   int error = dymon->start((void *)path); //connect to labelwriter
   if (error == 0)
   {
      const int copies = (argCopies->count ? argCopies->ival[0] : 1);
      for (int i = 0; i < copies; ++i) 
      {
         dymon->print_bitmap(bitmapFile, ((i+1) < copies));
      }
      dymon->end(); //finalize printing (form-feed) and close socket
   }

   // Clean up
   delete dymon;
   return error;
}